

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O0

LargeRepKind __thiscall google::protobuf::internal::MicroString::large_rep_kind(MicroString *this)

{
  bool bVar1;
  LogMessage *pLVar2;
  LargeRep *pLVar3;
  LargeRepKind local_64;
  size_t cap;
  LogMessage local_28;
  Voidify local_11;
  MicroString *local_10;
  MicroString *this_local;
  
  local_10 = this;
  bVar1 = is_large_rep(this);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.h"
               ,0x12a,"is_large_rep()");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  }
  pLVar3 = large_rep(this);
  local_64 = pLVar3->capacity;
  if (kString < local_64) {
    local_64 = kOwned;
  }
  return local_64;
}

Assistant:

LargeRepKind large_rep_kind() const {
    ABSL_DCHECK(is_large_rep());
    size_t cap = large_rep()->capacity;
    return cap >= kOwned ? kOwned : static_cast<LargeRepKind>(cap);
  }